

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O0

Key __thiscall QPMCache::insert(QPMCache *this,QPixmap *pixmap,int cost)

{
  long lVar1;
  bool bVar2;
  QPixmapCacheEntry *object;
  undefined4 in_ECX;
  QCache<QPixmapCache::Key,_QPixmapCacheEntry> *in_RDX;
  QPixmap *in_RSI;
  Duration in_RDI;
  long in_FS_OFFSET;
  bool success;
  Key *cacheKey;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff98;
  QExplicitlySharedDataPointer<QPlatformPixmap> *key;
  KeyData *this_00;
  QPMCache *in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  (((KeyData *)in_RDI.__r)->stringKey).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (KeyData *)in_RDI.__r;
  createKey(in_stack_ffffffffffffffc8);
  key = &in_RSI->data;
  object = (QPixmapCacheEntry *)operator_new(0x20);
  QPixmapCacheEntry::QPixmapCacheEntry((QPixmapCacheEntry *)this_00,(Key *)key,in_RSI);
  bVar2 = QCache<QPixmapCache::Key,_QPixmapCacheEntry>::insert
                    (in_RDX,(Key *)CONCAT44(in_ECX,CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffffd2
                                                                           ,
                                                  in_stack_ffffffffffffffd0))),object,
                     (qsizetype)this_00);
  if ((bVar2) && (bVar2 = QBasicTimer::isActive((QBasicTimer *)(in_RSI + 4)), !bVar2)) {
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)(in_RSI + 4),
               in_stack_ffffffffffffff98);
    QBasicTimer::start((QBasicTimer *)in_stack_ffffffffffffff98,in_RDI,(QObject *)0x327cde);
    *(undefined1 *)&in_RSI[5].super_QPaintDevice._vptr_QPaintDevice = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Key)(KeyData *)in_RDI.__r;
  }
  __stack_chk_fail();
}

Assistant:

QPixmapCache::Key QPMCache::insert(const QPixmap &pixmap, int cost)
{
    QPixmapCache::Key cacheKey = createKey(); // invalidated by ~QPixmapCacheEntry on failed insert
    bool success = QCache<QPixmapCache::Key, QPixmapCacheEntry>::insert(cacheKey, new QPixmapCacheEntry(cacheKey, pixmap), cost);
    Q_ASSERT(success || !cacheKey.isValid());
    if (success) {
        if (!timer.isActive()) {
            timer.start(flush_time, this);
            t = false;
        }
    }
    return cacheKey;
}